

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O1

void draw_filenew(Fl_Color c)

{
  Fl_Color FVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,c);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x26])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe6666666666666,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fb999999999999a,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fb999999999999a,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe6666666666666,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe6666666666666,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe6666666666666,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x28])();
  FVar1 = fl_color_average(c,0xff,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fb999999999999a,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fb999999999999a,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe6666666666666,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  FVar1 = fl_color_average(c,0x38,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe6666666666666,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fb999999999999a,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fb999999999999a,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe6666666666666,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe6666666666666,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe6666666666666,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x19])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fb999999999999a,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe6666666666666,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x23])();
  return;
}

Assistant:

static void draw_filenew(Fl_Color c) {
  fl_color(c);
  BCP;
    vv(-0.7, -1.0);
    vv(0.1, -1.0);
    vv(0.1, -0.4);
    vv(0.7, -0.4);
    vv(0.7, 1.0);
    vv(-0.7, 1.0);
  ECP;

  fl_color(fl_lighter(c));
  BP;
    vv(0.1, -1.0);
    vv(0.1, -0.4);
    vv(0.7, -0.4);
  EP;

  fl_color(fl_darker(c));
  BC;
    vv(-0.7, -1.0);
    vv(0.1, -1.0);
    vv(0.1, -0.4);
    vv(0.7, -0.4);
    vv(0.7, 1.0);
    vv(-0.7, 1.0);
  EC;

  BL;
    vv(0.1, -1.0);
    vv(0.7, -0.4);
  EL;
}